

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O0

IRIns * sink_checkalloc(jit_State *J,IRIns *irs)

{
  IRIns *ir;
  IRIns *irs_local;
  jit_State *J_local;
  IRIns *local_8;
  
  ir = (J->cur).ir + (irs->field_0).op1;
  if ((ir->field_0).op2 < 0x8000) {
    if (((ir->field_1).o == '9') || ((ir->field_1).o == '8')) {
      ir = (J->cur).ir + (ir->field_0).op1;
    }
    else if (((((ir->field_1).o != ':') && ((ir->field_1).o != ';')) && ((ir->field_1).o != '>')) &&
            ((ir->field_1).o != ')')) {
      return (IRIns *)0x0;
    }
    local_8 = (J->cur).ir + (ir->field_0).op1;
    if ((((local_8->field_1).o != 'O') && ((local_8->field_1).o != 'P')) &&
       ((local_8->field_1).o != 'Q')) {
      local_8 = (IRIns *)0x0;
    }
  }
  else {
    local_8 = (IRIns *)0x0;
  }
  return local_8;
}

Assistant:

static IRIns *sink_checkalloc(jit_State *J, IRIns *irs)
{
  IRIns *ir = IR(irs->op1);
  if (!irref_isk(ir->op2))
    return NULL;  /* Non-constant key. */
  if (ir->o == IR_HREFK || ir->o == IR_AREF)
    ir = IR(ir->op1);
  else if (!(ir->o == IR_HREF || ir->o == IR_NEWREF ||
	     ir->o == IR_FREF || ir->o == IR_ADD))
    return NULL;  /* Unhandled reference type (for XSTORE). */
  ir = IR(ir->op1);
  if (!(ir->o == IR_TNEW || ir->o == IR_TDUP || ir->o == IR_CNEW))
    return NULL;  /* Not an allocation. */
  return ir;  /* Return allocation. */
}